

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshal.c
# Opt level: O3

void BinarySink_put_fmtv(BinarySink *bs,char *fmt,__va_list_tag *ap)

{
  _func_void_BinarySink_ptr_void_ptr_size_t *p_Var1;
  char *__s;
  size_t sVar2;
  
  if (bs->writefmtv != (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0) {
    (*bs->writefmtv)(bs,fmt,ap);
    return;
  }
  __s = dupvprintf(fmt,ap);
  p_Var1 = bs->write;
  sVar2 = strlen(__s);
  (*p_Var1)(bs,__s,sVar2);
  burnstr(__s);
  return;
}

Assistant:

void BinarySink_put_fmtv(BinarySink *bs, const char *fmt, va_list ap)
{
    if (bs->writefmtv) {
        bs->writefmtv(bs, fmt, ap);
    } else {
        char *str = dupvprintf(fmt, ap);
        bs->write(bs, str, strlen(str));
        burnstr(str);
    }
}